

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  bool bVar1;
  bool bVar2;
  string part;
  string local_b8;
  string *local_98;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_98 = name;
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    do {
      local_90.piece_._M_len = (size_t)local_90.digits_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".","");
      bVar1 = TryConsume(this,(string *)&local_90);
      if ((char *)local_90.piece_._M_len != local_90.digits_) {
        operator_delete((void *)local_90.piece_._M_len,local_90.digits_._0_8_ + 1);
      }
      if (!bVar1) break;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      bVar2 = ConsumeIdentifier(this,&local_b8);
      if (bVar2) {
        local_90.piece_._M_len = 1;
        local_90.piece_._M_str = ".";
        local_60.piece_._M_len = local_b8._M_string_length;
        local_60.piece_._M_str = local_b8._M_dataplus._M_p;
        absl::lts_20250127::StrAppend(local_98,&local_90,&local_60);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
    } while (bVar2);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConsumeFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      std::string part;
      DO(ConsumeIdentifier(&part));
      absl::StrAppend(name, ".", part);
    }
    return true;
  }